

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O2

bool __thiscall
cmExportInstallFileGenerator::GenerateMainFile(cmExportInstallFileGenerator *this,ostream *os)

{
  cmExportSet *pcVar1;
  pointer puVar2;
  cmTargetExport *targetExport;
  cmGeneratorTarget *target;
  pointer pbVar3;
  bool bVar4;
  pointer ppcVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  TargetType TVar9;
  PolicyStatus PVar10;
  int iVar11;
  ostream *poVar12;
  string *psVar13;
  pointer ppcVar14;
  cmValue cVar15;
  byte bVar16;
  char *pcVar17;
  char *pcVar18;
  bool bVar19;
  cmExportInstallFileGenerator *this_00;
  string *c;
  pointer puVar20;
  pointer pbVar21;
  pair<std::_Rb_tree_iterator<cmGeneratorTarget_*>,_bool> pVar22;
  string sep;
  string expectedTargets;
  vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> allTargets;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_1c8;
  ostringstream e;
  undefined4 local_1a0 [2];
  undefined1 local_198 [24];
  undefined8 local_180;
  
  allTargets.super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  allTargets.super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  allTargets.super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  expectedTargets._M_dataplus._M_p = (pointer)&expectedTargets.field_2;
  expectedTargets._M_string_length = 0;
  expectedTargets.field_2._M_local_buf[0] = '\0';
  sep._M_dataplus._M_p = (pointer)&sep.field_2;
  sep._M_string_length = 0;
  sep.field_2._M_local_buf[0] = '\0';
  pcVar1 = this->IEGen->ExportSet;
  puVar2 = (pcVar1->TargetExports).
           super__Vector_base<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar20 = (pcVar1->TargetExports).
                 super__Vector_base<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar20 != puVar2; puVar20 = puVar20 + 1
      ) {
    if (((puVar20->_M_t).super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>
         ._M_t.super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>.
         super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->NamelinkOnly == false) {
      std::operator+(&local_1e8,&sep,&(this->super_cmExportFileGenerator).Namespace);
      cmGeneratorTarget::GetExportName_abi_cxx11_
                (&local_1c8,
                 ((puVar20->_M_t).
                  super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>._M_t.
                  super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>.
                  super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->Target);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                     &local_1e8,&local_1c8);
      std::__cxx11::string::append((string *)&expectedTargets);
      std::__cxx11::string::~string((string *)&e);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::assign((char *)&sep);
      pVar22 = std::
               _Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
               ::_M_insert_unique<cmGeneratorTarget*const&>
                         ((_Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
                           *)&(this->super_cmExportFileGenerator).ExportedTargets,
                          &((puVar20->_M_t).
                            super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>
                            .super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->Target);
      if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar12 = std::operator<<((ostream *)&e,"install(EXPORT \"");
        poVar12 = std::operator<<(poVar12,(string *)&this->IEGen->ExportSet->Name);
        poVar12 = std::operator<<(poVar12,"\" ...) ");
        poVar12 = std::operator<<(poVar12,"includes target \"");
        psVar13 = cmGeneratorTarget::GetName_abi_cxx11_
                            (((puVar20->_M_t).
                              super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>
                              .super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->Target)
        ;
        poVar12 = std::operator<<(poVar12,(string *)psVar13);
        std::operator<<(poVar12,"\" more than once in the export set.");
        std::__cxx11::stringbuf::str();
        cmSystemTools::Error(&local_1e8);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
        goto LAB_00463354;
      }
      _e = (pointer)(puVar20->_M_t).
                    super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>._M_t
                    .super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>.
                    super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl;
      std::vector<cmTargetExport*,std::allocator<cmTargetExport*>>::emplace_back<cmTargetExport*>
                ((vector<cmTargetExport*,std::allocator<cmTargetExport*>> *)&allTargets,
                 (cmTargetExport **)&e);
    }
  }
  (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0xb])(this,os,&expectedTargets);
LAB_00463354:
  std::__cxx11::string::~string((string *)&sep);
  std::__cxx11::string::~string((string *)&expectedTargets);
  if (puVar20 == puVar2) {
    this_00 = this;
    (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x17])(this,os);
    ppcVar5 = allTargets.super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    bVar4 = false;
    bVar8 = false;
    bVar19 = false;
    bVar16 = 0;
    ppcVar14 = allTargets.super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    do {
      if (ppcVar14 == ppcVar5) {
        if ((bVar8 || bVar19) || (bVar16 & 1) != 0) {
          pcVar17 = "2.8.12";
          if (bVar19) {
            pcVar17 = "3.0.0";
          }
          pcVar18 = "3.1.0";
          if (!bVar8) {
            pcVar18 = pcVar17;
          }
          (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x10])(this,os,pcVar18);
        }
        (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x18])(this,os);
        cmExportFileGenerator::GenerateCxxModuleInformation(&this->super_cmExportFileGenerator,os);
        bVar19 = true;
        if (bVar4) {
          pbVar3 = (this->super_cmExportFileGenerator).Configurations.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          bVar19 = true;
          for (pbVar21 = (this->super_cmExportFileGenerator).Configurations.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; pbVar21 != pbVar3;
              pbVar21 = pbVar21 + 1) {
            bVar8 = GenerateImportCxxModuleConfigTargetInclusion(this,pbVar21);
            bVar19 = (bool)(bVar19 & bVar8);
          }
        }
        (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x19])(this,os);
        (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[9])(this,os);
        if (bVar4) {
          pbVar3 = (this->super_cmExportFileGenerator).Configurations.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pbVar21 = (this->super_cmExportFileGenerator).Configurations.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; pbVar21 != pbVar3;
              pbVar21 = pbVar21 + 1) {
            iVar11 = (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x1a])
                               (this,pbVar21);
            bVar19 = (bool)(bVar19 & (byte)iVar11);
          }
        }
        (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[10])(this,os);
        goto LAB_0046376e;
      }
      targetExport = *ppcVar14;
      target = targetExport->Target;
      TVar9 = GetExportTargetType(this_00,targetExport);
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[6])
                (this,os,target,(ulong)TVar9);
      local_1a0[0] = 0;
      local_198._0_8_ = 0;
      local_198._8_8_ = local_1a0;
      local_180._0_1_ = false;
      local_180._1_7_ = 0;
      local_198._16_8_ = local_198._8_8_;
      cmExportFileGenerator::PopulateIncludeDirectoriesInterface
                (&this->super_cmExportFileGenerator,target,InstallInterface,(ImportPropertyMap *)&e,
                 targetExport);
      cmExportFileGenerator::PopulateSourcesInterface
                (&this->super_cmExportFileGenerator,target,InstallInterface,(ImportPropertyMap *)&e)
      ;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&expectedTargets,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES",
                 (allocator<char> *)&sep);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&expectedTargets,target,InstallInterface,
                 (ImportPropertyMap *)&e);
      std::__cxx11::string::~string((string *)&expectedTargets);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&expectedTargets,"INTERFACE_COMPILE_DEFINITIONS",(allocator<char> *)&sep)
      ;
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&expectedTargets,target,InstallInterface,
                 (ImportPropertyMap *)&e);
      std::__cxx11::string::~string((string *)&expectedTargets);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&expectedTargets,"INTERFACE_COMPILE_OPTIONS",(allocator<char> *)&sep);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&expectedTargets,target,InstallInterface,
                 (ImportPropertyMap *)&e);
      std::__cxx11::string::~string((string *)&expectedTargets);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&expectedTargets,"INTERFACE_PRECOMPILE_HEADERS",(allocator<char> *)&sep);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&expectedTargets,target,InstallInterface,
                 (ImportPropertyMap *)&e);
      std::__cxx11::string::~string((string *)&expectedTargets);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&expectedTargets,"INTERFACE_AUTOUIC_OPTIONS",(allocator<char> *)&sep);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&expectedTargets,target,InstallInterface,
                 (ImportPropertyMap *)&e);
      std::__cxx11::string::~string((string *)&expectedTargets);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&expectedTargets,"INTERFACE_COMPILE_FEATURES",(allocator<char> *)&sep);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&expectedTargets,target,InstallInterface,
                 (ImportPropertyMap *)&e);
      std::__cxx11::string::~string((string *)&expectedTargets);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&expectedTargets,"INTERFACE_LINK_OPTIONS",(allocator<char> *)&sep);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&expectedTargets,target,InstallInterface,
                 (ImportPropertyMap *)&e);
      std::__cxx11::string::~string((string *)&expectedTargets);
      cmExportFileGenerator::PopulateLinkDirectoriesInterface
                (&this->super_cmExportFileGenerator,target,InstallInterface,(ImportPropertyMap *)&e)
      ;
      cmExportFileGenerator::PopulateLinkDependsInterface
                (&this->super_cmExportFileGenerator,target,InstallInterface,(ImportPropertyMap *)&e)
      ;
      expectedTargets._M_dataplus._M_p = (pointer)&expectedTargets.field_2;
      expectedTargets._M_string_length = 0;
      expectedTargets.field_2._M_local_buf[0] = '\0';
      bVar6 = cmExportFileGenerator::PopulateExportProperties
                        (&this->super_cmExportFileGenerator,target,(ImportPropertyMap *)&e,
                         &expectedTargets);
      if (bVar6) {
        PVar10 = cmGeneratorTarget::GetPolicyStatusCMP0022(target);
        if (PVar10 != WARN) {
          PVar10 = cmGeneratorTarget::GetPolicyStatusCMP0022(target);
          if (PVar10 != OLD) {
            bVar7 = cmExportFileGenerator::PopulateInterfaceLinkLibrariesProperty
                              (&this->super_cmExportFileGenerator,target,InstallInterface,
                               (ImportPropertyMap *)&e);
            if (bVar7) {
              bVar16 = bVar16 | (this->super_cmExportFileGenerator).ExportOld ^ 1U;
            }
          }
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&sep,"INTERFACE_SOURCES",(allocator<char> *)&local_1e8);
        cVar15 = cmGeneratorTarget::GetProperty(target,&sep);
        std::__cxx11::string::~string((string *)&sep);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&sep,"INTERFACE_POSITION_INDEPENDENT_CODE",
                   (allocator<char> *)&local_1e8);
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&sep,target,(ImportPropertyMap *)&e);
        std::__cxx11::string::~string((string *)&sep);
        cmExportFileGenerator::PopulateCompatibleInterfaceProperties
                  (&this->super_cmExportFileGenerator,target,(ImportPropertyMap *)&e);
        (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0xf])(this,target,os,&e);
        cmExportFileGenerator::GenerateTargetFileSets
                  (&this->super_cmExportFileGenerator,target,os,targetExport);
        bVar19 = (bool)(bVar19 | TVar9 == INTERFACE_LIBRARY);
        bVar8 = (bool)(bVar8 | cVar15.Value != (string *)0x0);
      }
      else {
        cmSystemTools::Error(&expectedTargets);
      }
      bVar4 = (bool)(bVar4 | TVar9 != INTERFACE_LIBRARY);
      std::__cxx11::string::~string((string *)&expectedTargets);
      this_00 = (cmExportInstallFileGenerator *)&e;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)this_00);
      ppcVar14 = ppcVar14 + 1;
    } while (bVar6);
  }
  bVar19 = false;
LAB_0046376e:
  std::_Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::~_Vector_base
            (&allTargets.super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>);
  return bVar19;
}

Assistant:

bool cmExportInstallFileGenerator::GenerateMainFile(std::ostream& os)
{
  std::vector<cmTargetExport*> allTargets;
  {
    std::string expectedTargets;
    std::string sep;
    for (std::unique_ptr<cmTargetExport> const& te :
         this->IEGen->GetExportSet()->GetTargetExports()) {
      if (te->NamelinkOnly) {
        continue;
      }
      expectedTargets += sep + this->Namespace + te->Target->GetExportName();
      sep = " ";
      if (this->ExportedTargets.insert(te->Target).second) {
        allTargets.push_back(te.get());
      } else {
        std::ostringstream e;
        e << "install(EXPORT \"" << this->IEGen->GetExportSet()->GetName()
          << "\" ...) "
          << "includes target \"" << te->Target->GetName()
          << "\" more than once in the export set.";
        cmSystemTools::Error(e.str());
        return false;
      }
    }

    this->GenerateExpectedTargetsCode(os, expectedTargets);
  }

  // Compute the relative import prefix for the file
  this->GenerateImportPrefix(os);

  bool require2_8_12 = false;
  bool require3_0_0 = false;
  bool require3_1_0 = false;
  bool requiresConfigFiles = false;
  // Create all the imported targets.
  for (cmTargetExport* te : allTargets) {
    cmGeneratorTarget* gt = te->Target;
    cmStateEnums::TargetType targetType = this->GetExportTargetType(te);

    requiresConfigFiles =
      requiresConfigFiles || targetType != cmStateEnums::INTERFACE_LIBRARY;

    this->GenerateImportTargetCode(os, gt, targetType);

    ImportPropertyMap properties;

    this->PopulateIncludeDirectoriesInterface(
      gt, cmGeneratorExpression::InstallInterface, properties, *te);
    this->PopulateSourcesInterface(gt, cmGeneratorExpression::InstallInterface,
                                   properties);
    this->PopulateInterfaceProperty("INTERFACE_SYSTEM_INCLUDE_DIRECTORIES", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_DEFINITIONS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_OPTIONS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_PRECOMPILE_HEADERS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_AUTOUIC_OPTIONS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_FEATURES", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_LINK_OPTIONS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties);
    this->PopulateLinkDirectoriesInterface(
      gt, cmGeneratorExpression::InstallInterface, properties);
    this->PopulateLinkDependsInterface(
      gt, cmGeneratorExpression::InstallInterface, properties);

    std::string errorMessage;
    if (!this->PopulateExportProperties(gt, properties, errorMessage)) {
      cmSystemTools::Error(errorMessage);
      return false;
    }

    const bool newCMP0022Behavior =
      gt->GetPolicyStatusCMP0022() != cmPolicies::WARN &&
      gt->GetPolicyStatusCMP0022() != cmPolicies::OLD;
    if (newCMP0022Behavior) {
      if (this->PopulateInterfaceLinkLibrariesProperty(
            gt, cmGeneratorExpression::InstallInterface, properties) &&
          !this->ExportOld) {
        require2_8_12 = true;
      }
    }
    if (targetType == cmStateEnums::INTERFACE_LIBRARY) {
      require3_0_0 = true;
    }
    if (gt->GetProperty("INTERFACE_SOURCES")) {
      // We can only generate INTERFACE_SOURCES in CMake 3.3, but CMake 3.1
      // can consume them.
      require3_1_0 = true;
    }

    this->PopulateInterfaceProperty("INTERFACE_POSITION_INDEPENDENT_CODE", gt,
                                    properties);

    this->PopulateCompatibleInterfaceProperties(gt, properties);

    this->GenerateInterfaceProperties(gt, os, properties);

    this->GenerateTargetFileSets(gt, os, te);
  }

  if (require3_1_0) {
    this->GenerateRequiredCMakeVersion(os, "3.1.0");
  } else if (require3_0_0) {
    this->GenerateRequiredCMakeVersion(os, "3.0.0");
  } else if (require2_8_12) {
    this->GenerateRequiredCMakeVersion(os, "2.8.12");
  }

  this->LoadConfigFiles(os);

  bool result = true;

  this->GenerateCxxModuleInformation(os);
  if (requiresConfigFiles) {
    for (std::string const& c : this->Configurations) {
      if (!this->GenerateImportCxxModuleConfigTargetInclusion(c)) {
        result = false;
      }
    }
  }

  this->CleanupTemporaryVariables(os);
  this->GenerateImportedFileCheckLoop(os);

  // Generate an import file for each configuration.
  // Don't do this if we only export INTERFACE_LIBRARY targets.
  if (requiresConfigFiles) {
    for (std::string const& c : this->Configurations) {
      if (!this->GenerateImportFileConfig(c)) {
        result = false;
      }
    }
  }

  this->GenerateMissingTargetsCheckCode(os);

  return result;
}